

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spanning_tree.cc
# Opt level: O0

void __thiscall VW::SpanningTree::Start(SpanningTree *this)

{
  element_type *peVar1;
  future<void> *in_RDI;
  SpanningTree **in_stack_00000028;
  type *in_stack_00000030;
  launch in_stack_0000003c;
  future<void> *this_00;
  
  if (in_RDI[1].super___basic_future<void>._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    peVar1 = (element_type *)operator_new(0x10);
    std::future<void>::future((future<void> *)0x105521);
    in_RDI[1].super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         peVar1;
  }
  this_00 = in_RDI;
  std::async<void(VW::SpanningTree::*)(),VW::SpanningTree*>
            (in_stack_0000003c,in_stack_00000030,in_stack_00000028);
  std::future<void>::operator=(this_00,in_RDI);
  std::future<void>::~future((future<void> *)0x105584);
  return;
}

Assistant:

void SpanningTree::Start()
{
  // launch async
  if (m_future == nullptr)
  {
    m_future = new future<void>;
  }

  *m_future = std::async(std::launch::async, &SpanningTree::Run, this);
}